

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O2

void __thiscall
amrex::STLtools::fillFab
          (STLtools *this,BaseFab<double> *levelset,Geometry *geom,RunOn param_3,Box *param_4)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  pointer pTVar13;
  double *pdVar14;
  undefined3 uVar15;
  bool bVar16;
  pointer pTVar17;
  XDim3 *pXVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  byte bVar27;
  long lVar28;
  long lVar29;
  byte bVar30;
  undefined4 unaff_R13D;
  int iVar31;
  double *pdVar32;
  uint uVar39;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  uint uVar40;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar41;
  double dVar42;
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar54;
  undefined1 auVar53 [16];
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dStack_2d0;
  double dStack_2b0;
  double adStack_108 [6];
  double local_d8;
  double dStack_d0;
  double local_c8;
  double local_c0;
  double dStack_b8;
  double local_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  undefined4 local_40;
  uint uStack_3c;
  undefined4 uStack_38;
  uint uStack_34;
  
  dVar2 = (geom->prob_domain).xlo[0];
  dVar3 = (geom->prob_domain).xlo[1];
  dVar4 = (geom->prob_domain).xlo[2];
  dVar5 = (geom->super_CoordSys).dx[0];
  dVar6 = (geom->super_CoordSys).dx[1];
  dVar7 = (geom->super_CoordSys).dx[2];
  pTVar13 = (this->m_tri_pts_d).m_data;
  local_c8 = (this->m_ptmin).z;
  local_d8 = (this->m_ptmin).x;
  dStack_d0 = (this->m_ptmin).y;
  local_b0 = (this->m_ptmax).z;
  local_c0 = (this->m_ptmax).x;
  dStack_b8 = (this->m_ptmax).y;
  local_a8 = (this->m_ptref).x;
  dStack_a0 = (this->m_ptref).y;
  local_98 = (this->m_ptref).z;
  pdVar14 = levelset->dptr;
  iVar10 = (levelset->domain).smallend.vect[0];
  lVar29 = (long)iVar10;
  lVar20 = (long)(levelset->domain).smallend.vect[1];
  lVar28 = (long)(levelset->domain).smallend.vect[2];
  iVar11 = (levelset->domain).bigend.vect[0];
  iVar1 = iVar11 + 1;
  lVar23 = (long)(levelset->domain).bigend.vect[1];
  iVar12 = (levelset->domain).bigend.vect[2];
  lVar25 = iVar1 - lVar29;
  uVar39 = (uint)((long)((ulong)*(uint *)&this->m_boundry_is_outside << 0x3f) >> 0x3f);
  uVar40 = (uint)((long)((ulong)*(uint *)&this->m_boundry_is_outside << 0x3f) >> 0x3f);
  local_40 = 0;
  uStack_3c = uVar39 & 0xbff00000 | ~uVar39 & 0x3ff00000;
  uStack_38 = 0;
  uStack_34 = uVar40 & 0x3ff00000 | ~uVar40 & 0xbff00000;
  uVar21 = 0;
  if (0 < this->m_num_tri) {
    uVar21 = (ulong)(uint)this->m_num_tri;
  }
  dVar55 = -local_98;
  lVar19 = lVar28;
  do {
    if (iVar12 < lVar19) {
      return;
    }
    dVar56 = (double)(int)lVar19 * dVar7 + dVar4;
    dVar41 = dVar56;
    if (dVar56 <= local_98) {
      dVar41 = local_98;
    }
    dVar42 = dVar56;
    if (local_98 <= dVar56) {
      dVar42 = local_98;
    }
    dVar33 = local_98 - dVar56;
    auVar44._0_8_ = -dVar56;
    auVar44._8_4_ = SUB84(dVar56,0);
    auVar44._12_4_ = (int)((ulong)auVar44._0_8_ >> 0x20);
    for (lVar24 = lVar20; lVar24 <= lVar23; lVar24 = lVar24 + 1) {
      if (iVar10 <= iVar11) {
        dVar79 = (double)(int)lVar24 * dVar6 + dVar3;
        dVar34 = dVar79;
        if (dVar79 <= dStack_a0) {
          dVar34 = dStack_a0;
        }
        dVar35 = dVar79;
        if (dStack_a0 <= dVar79) {
          dVar35 = dStack_a0;
        }
        dVar48 = dStack_a0 * dVar56 + dVar79 * dVar55;
        dVar36 = dVar79 - dStack_a0;
        auVar45._0_8_ = -dVar79;
        auVar45._8_4_ = SUB84(dVar79,0);
        auVar45._12_4_ = (int)((ulong)auVar45._0_8_ >> 0x20);
        lVar22 = lVar29;
        do {
          dVar70 = (double)(int)lVar22 * dVar5 + dVar2;
          lVar26 = 200;
          if (((((local_d8 <= dVar70) && (dVar70 <= local_c0)) && (dStack_d0 <= dVar79)) &&
              ((dVar79 <= dStack_b8 && (local_c8 <= dVar56)))) && (dVar56 <= local_b0)) {
            dVar75 = dVar70;
            if (dVar70 <= local_a8) {
              dVar75 = local_a8;
            }
            dVar62 = dVar70;
            if (local_a8 <= dVar70) {
              dVar62 = local_a8;
            }
            dVar49 = local_a8 * dVar79 + dVar70 * -dStack_a0;
            dVar66 = local_a8 * dVar56 + dVar70 * dVar55;
            dVar43 = local_a8 - dVar70;
            uVar39 = 0;
            for (lVar26 = 0; uVar21 * 0x48 - lVar26 != 0; lVar26 = lVar26 + 0x48) {
              dVar67 = *(double *)((long)&(pTVar13->v1).x + lVar26);
              dVar52 = *(double *)((long)&(pTVar13->v2).x + lVar26);
              dVar68 = *(double *)((long)&(pTVar13->v3).x + lVar26);
              dVar72 = dVar52;
              if (dVar67 <= dVar52) {
                dVar72 = dVar67;
              }
              dVar54 = dVar68;
              if (dVar72 <= dVar68) {
                dVar54 = dVar72;
              }
              if (dVar54 <= dVar75) {
                dVar72 = dVar52;
                pTVar17 = (pointer)&pTVar13->v2;
                if (dVar52 <= dVar67) {
                  dVar72 = dVar67;
                  pTVar17 = pTVar13;
                }
                if (dVar72 < dVar68) {
                  pTVar17 = (pointer)&pTVar13->v3;
                }
                pdVar32 = (double *)((long)&(pTVar17->v1).x + lVar26);
                if (dVar62 < *pdVar32 || dVar62 == *pdVar32) {
                  dVar72 = *(double *)((long)&(pTVar13->v1).y + lVar26);
                  dVar54 = *(double *)((long)&(pTVar13->v2).y + lVar26);
                  dVar74 = *(double *)((long)&(pTVar13->v3).y + lVar26);
                  dVar8 = dVar54;
                  if (dVar72 <= dVar54) {
                    dVar8 = dVar72;
                  }
                  dVar81 = dVar74;
                  if (dVar8 <= dVar74) {
                    dVar81 = dVar8;
                  }
                  if (dVar81 <= dVar34) {
                    dVar8 = dVar54;
                    pXVar18 = &pTVar13->v2;
                    if (dVar54 <= dVar72) {
                      dVar8 = dVar72;
                      pXVar18 = &pTVar13->v1;
                    }
                    if (dVar8 < dVar74) {
                      pXVar18 = &pTVar13->v3;
                    }
                    pdVar32 = (double *)((long)&pXVar18->y + lVar26);
                    if (dVar35 < *pdVar32 || dVar35 == *pdVar32) {
                      dVar8 = *(double *)((long)&(pTVar13->v1).z + lVar26);
                      dVar81 = *(double *)((long)&(pTVar13->v2).z + lVar26);
                      dVar9 = *(double *)((long)&(pTVar13->v3).z + lVar26);
                      dVar50 = dVar81;
                      if (dVar8 <= dVar81) {
                        dVar50 = dVar8;
                      }
                      dVar51 = dVar9;
                      if (dVar50 <= dVar9) {
                        dVar51 = dVar50;
                      }
                      if (dVar51 <= dVar41) {
                        dVar50 = dVar81;
                        pXVar18 = &pTVar13->v2;
                        if (dVar81 <= dVar8) {
                          dVar50 = dVar8;
                          pXVar18 = &pTVar13->v1;
                        }
                        if (dVar50 < dVar9) {
                          pXVar18 = &pTVar13->v3;
                        }
                        pdVar32 = (double *)((long)&pXVar18->z + lVar26);
                        if (dVar42 < *pdVar32 || dVar42 == *pdVar32) {
                          dVar59 = dVar52 - dVar68;
                          dVar60 = dVar81 - dVar9;
                          dVar71 = dVar54 - dVar72;
                          dVar73 = dVar72 - dVar74;
                          dVar57 = dVar74 - dVar54;
                          dVar63 = dVar68 * dVar72 - dVar67 * dVar74;
                          dVar64 = dVar68 * dVar8 - dVar67 * dVar9;
                          dVar80 = dVar74 * dVar8 - dVar72 * dVar9;
                          dVar65 = dVar52 * dVar74 - dVar68 * dVar54;
                          dVar76 = dVar52 * dVar9 - dVar68 * dVar81;
                          dVar78 = dVar9 * dVar54 - dVar74 * dVar81;
                          dVar58 = dVar36 * (dVar67 * dVar81 - dVar52 * dVar8) +
                                   dVar33 * (dVar67 * dVar54 - dVar52 * dVar72) +
                                   dVar48 * (dVar67 - dVar52) +
                                   dVar43 * (dVar81 * dVar72 - dVar54 * dVar8) +
                                   dVar49 * (dVar8 - dVar81) + dVar66 * dVar71;
                          dVar61 = dVar36 * dVar76 +
                                   dVar33 * dVar65 +
                                   dVar48 * dVar59 +
                                   dVar43 * dVar78 + dVar49 * dVar60 + dVar66 * dVar57;
                          dVar50 = dVar9 - dVar8;
                          dVar51 = dVar68 - dVar67;
                          dVar69 = dVar36 * dVar64 +
                                   dVar33 * dVar63 +
                                   dVar48 * dVar51 +
                                   dVar43 * dVar80 + dVar49 * dVar50 + dVar66 * dVar73;
                          auVar38._8_8_ = -(ulong)(ABS(dVar61) < 2.220446049250313e-16);
                          auVar38._0_8_ = -(ulong)(ABS(dVar58) < 2.220446049250313e-16);
                          uVar40 = movmskpd((int)pdVar32,auVar38);
                          bVar30 = (byte)uVar40;
                          dVar77 = ABS(dVar69);
                          bVar27 = dVar77 < 2.220446049250313e-16 & bVar30 >> 1;
                          if (((uVar40 & 1) == 0) || (bVar27 == 0)) {
                            dVar68 = -dVar8;
                            if ((0.0 <= dVar69) || ((0.0 <= dVar58 || (0.0 <= dVar61)))) {
                              auVar47._8_8_ = -(ulong)(0.0 < dVar61);
                              auVar47._0_8_ = -(ulong)(0.0 < dVar58);
                              iVar31 = movmskpd(unaff_R13D,auVar47);
                              uVar15 = (undefined3)((uint)iVar31 >> 8);
                              unaff_R13D = CONCAT31(uVar15,iVar31 == 3);
                              if (((0.0 < dVar69) && (iVar31 == 3)) ||
                                 (((bVar16 = 0.0 < dVar61 * dVar69,
                                   unaff_R13D = CONCAT31(uVar15,bVar16), (bVar30 & bVar16) != 0 ||
                                   (bVar16 = 0.0 < dVar69 * dVar58,
                                   unaff_R13D = CONCAT31(uVar15,bVar16), (bVar30 >> 1 & bVar16) != 0
                                   )) || ((dVar77 < 2.220446049250313e-16 && (0.0 < dVar61 * dVar58)
                                          ))))) goto LAB_005e94c6;
                              if ((uVar40 & 1) == 0) {
                                if (bVar27 == 0) goto LAB_005e95dc;
LAB_005e978c:
                                dVar67 = (dVar57 * (dVar70 * dVar8 + dVar67 * auVar44._0_8_) +
                                         dVar60 * (dVar70 * dVar72 + auVar45._0_8_ * dVar67) +
                                         dVar78 * (dVar70 - dVar67) +
                                         dVar59 * (dVar79 * dVar8 + auVar44._0_8_ * dVar72) +
                                         dVar65 * (dVar56 - dVar8) + (dVar72 - dVar79) * dVar76) *
                                         (dVar57 * (dVar67 * local_98 + local_a8 * dVar68) +
                                         dVar60 * (dVar67 * dStack_a0 + -dVar72 * local_a8) +
                                         dVar78 * (dVar67 - local_a8) +
                                         dVar59 * (dVar72 * local_98 + dVar68 * dStack_a0) +
                                         dVar65 * (dVar8 - local_98) + (dStack_a0 - dVar72) * dVar76
                                         );
                              }
                              else {
                                if (bVar30 >> 1 != 0) goto LAB_005e978c;
                                if (2.220446049250313e-16 <= dVar77) goto LAB_005e95dc;
                                dStack_2b0 = auVar45._8_8_;
                                dStack_2d0 = auVar44._8_8_;
                                dVar67 = (dVar73 * (dVar70 * dVar81 + dVar52 * dStack_2d0) +
                                         dVar50 * (dVar70 * dVar54 + dStack_2b0 * dVar52) +
                                         dVar80 * (dVar70 - dVar52) +
                                         dVar51 * (dVar79 * dVar81 + dStack_2d0 * dVar54) +
                                         dVar63 * (dVar56 - dVar81) + dVar64 * (dVar54 - dVar79)) *
                                         (dVar73 * (dVar52 * local_98 + local_a8 * -dVar81) +
                                         dVar50 * (dVar52 * dStack_a0 + -dVar54 * local_a8) +
                                         dVar80 * (dVar52 - local_a8) +
                                         dVar51 * (dVar54 * local_98 + -dVar81 * dStack_a0) +
                                         dVar63 * (dVar81 - local_98) +
                                         dVar64 * (dStack_a0 - dVar54));
                              }
                            }
                            else {
LAB_005e94c6:
                              dVar67 = (dVar57 * (local_a8 * dVar8 + dVar67 * dVar55) +
                                       dVar60 * (local_a8 * dVar72 + -dStack_a0 * dVar67) +
                                       dVar78 * (local_a8 - dVar67) +
                                       dVar59 * (dStack_a0 * dVar8 + dVar55 * dVar72) +
                                       dVar65 * (local_98 - dVar8) + (dVar72 - dStack_a0) * dVar76)
                                       * (dVar57 * (dVar67 * dVar56 + dVar70 * dVar68) +
                                         dVar60 * (dVar67 * dVar79 + -dVar72 * dVar70) +
                                         dVar78 * (dVar67 - dVar70) +
                                         dVar59 * (dVar72 * dVar56 + dVar68 * dVar79) +
                                         dVar65 * (dVar8 - dVar56) + (dVar79 - dVar72) * dVar76);
                            }
                            if (dVar67 <= 0.0) goto LAB_005e95dc;
                          }
                          else {
                            dVar77 = dVar52 - dVar67;
                            dVar78 = dVar67 - dVar68;
                            dVar60 = dVar81 - dVar8;
                            dVar63 = dVar8 - dVar9;
                            dVar76 = dVar68 - dVar52;
                            dVar80 = dVar9 - dVar81;
                            dVar58 = dVar77 * (dStack_a0 - dVar72) + -dVar71 * (local_a8 - dVar67);
                            dVar59 = dVar76 * (dStack_a0 - dVar54) + -dVar57 * (local_a8 - dVar52);
                            dVar61 = dVar71 * (local_98 - dVar8) + -dVar60 * (dStack_a0 - dVar72);
                            dVar64 = dVar57 * (local_98 - dVar81) + -dVar80 * (dStack_a0 - dVar54);
                            dVar65 = dVar60 * (local_a8 - dVar67) + -dVar77 * (local_98 - dVar8);
                            dVar69 = dVar80 * (local_a8 - dVar52) + -dVar76 * (local_98 - dVar81);
                            auVar37._0_8_ = dVar58 * dVar58 + dVar61 * dVar61 + dVar65 * dVar65;
                            auVar37._8_8_ = dVar59 * dVar59 + dVar64 * dVar64 + dVar69 * dVar69;
                            dVar58 = dVar71 * dVar50 - (dVar74 - dVar72) * dVar60;
                            dVar59 = dVar73 * (local_98 - dVar9) - (dStack_a0 - dVar74) * dVar63;
                            dVar61 = dVar60 * dVar51 - dVar50 * dVar77;
                            dVar64 = dVar63 * (local_a8 - dVar68) - (local_98 - dVar9) * dVar78;
                            dVar50 = dVar77 * (dVar74 - dVar72) - dVar51 * dVar71;
                            dVar51 = dVar78 * (dStack_a0 - dVar74) - (local_a8 - dVar68) * dVar73;
                            auVar38 = sqrtpd(auVar37,auVar37);
                            auVar46._0_8_ = dVar50 * dVar50 + dVar58 * dVar58 + dVar61 * dVar61;
                            auVar46._8_8_ = dVar51 * dVar51 + dVar59 * dVar59 + dVar64 * dVar64;
                            auVar47 = sqrtpd(auVar46,auVar46);
                            dVar50 = auVar47._0_8_ * 0.5;
                            if ((ABS((auVar47._8_8_ * 0.5 +
                                     auVar38._8_8_ * 0.5 + auVar38._0_8_ * 0.5) - dVar50) <=
                                 2.220446049250313e-16) &&
                               (dVar58 = dVar76 * (dVar79 - dVar54) + -dVar57 * (dVar70 - dVar52),
                               dVar51 = dVar57 * (dVar56 - dVar81) + (dVar79 - dVar54) * -dVar80,
                               dVar81 = dVar80 * (dVar70 - dVar52) + (dVar56 - dVar81) * -dVar76,
                               dVar52 = dVar77 * (dVar79 - dVar72) + -dVar71 * (dVar70 - dVar67),
                               dVar54 = dVar78 * (dVar79 - dVar74) + -dVar73 * (dVar70 - dVar68),
                               dVar72 = dVar71 * (dVar56 - dVar8) + (dVar79 - dVar72) * -dVar60,
                               dVar74 = dVar73 * (dVar56 - dVar9) + (dVar79 - dVar74) * -dVar63,
                               dVar67 = dVar60 * (dVar70 - dVar67) + (dVar56 - dVar8) * -dVar77,
                               dVar68 = dVar63 * (dVar70 - dVar68) + (dVar56 - dVar9) * -dVar78,
                               auVar53._0_8_ = dVar52 * dVar52 + dVar72 * dVar72 + dVar67 * dVar67,
                               auVar53._8_8_ = dVar54 * dVar54 + dVar74 * dVar74 + dVar68 * dVar68,
                               auVar38 = sqrtpd(auVar53,auVar53),
                               ABS((auVar38._8_8_ * 0.5 +
                                   SQRT(dVar58 * dVar58 + dVar51 * dVar51 + dVar81 * dVar81) * 0.5 +
                                   auVar38._0_8_ * 0.5) - dVar50) <= 2.220446049250313e-16))
                            goto LAB_005e95dc;
                          }
                          uVar39 = uVar39 + 1;
                        }
                      }
                    }
                  }
                }
              }
LAB_005e95dc:
            }
            lVar26 = (ulong)(uVar39 & 1) * 8 + 200;
          }
          pdVar14[(lVar19 - lVar28) * ((lVar23 - lVar20) + 1) * lVar25 +
                  (lVar24 - lVar20) * lVar25 + (lVar22 - lVar29)] =
               *(double *)((long)adStack_108 + lVar26);
          lVar22 = lVar22 + 1;
        } while (iVar1 != (int)lVar22);
      }
    }
    lVar19 = lVar19 + 1;
  } while( true );
}

Assistant:

void
STLtools::fillFab (BaseFab<Real>& levelset, const Geometry& geom, RunOn, Box const&) const
{
    int num_triangles = m_num_tri;

    const auto plo = geom.ProbLoArray();
    const auto dx  = geom.CellSizeArray();

    const Triangle* tri_pts = m_tri_pts_d.data();
    XDim3 ptmin = m_ptmin;
    XDim3 ptmax = m_ptmax;
    XDim3 ptref = m_ptref;
    Real reference_value = m_boundry_is_outside ? -1.0_rt :  1.0_rt;
    Real other_value     = m_boundry_is_outside ?  1.0_rt : -1.0_rt;

    auto const& a = levelset.array();
    const Box& bx = levelset.box();
    ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        Real coords[3];
        coords[0]=plo[0]+i*dx[0];
        coords[1]=plo[1]+j*dx[1];
#if (AMREX_SPACEDIM == 2)
        coords[2]=Real(0.);
#else
        coords[2]=plo[2]+k*dx[2];
#endif
        int num_intersects=0;
        if (coords[0] >= ptmin.x && coords[0] <= ptmax.x &&
            coords[1] >= ptmin.y && coords[1] <= ptmax.y &&
            coords[2] >= ptmin.z && coords[2] <= ptmax.z)
        {
            Real pr[]={ptref.x, ptref.y, ptref.z};
            for (int tr=0; tr < num_triangles; ++tr) {
                if (line_tri_intersects(pr, coords, tri_pts[tr])) {
                    ++num_intersects;
                }
            }
        }
        a(i,j,k) = (num_intersects % 2 == 0) ? reference_value : other_value;
    });
}